

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<double>
          (internal *this,char *lhs_expression,char *rhs_expression,double lhs_value,
          double rhs_value)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  stringstream local_390 [8];
  stringstream lhs_ss;
  long local_380;
  undefined8 auStack_378 [46];
  stringstream local_208 [8];
  stringstream rhs_ss;
  long local_1f8;
  undefined8 auStack_1f0 [46];
  FloatingPointUnion local_80;
  FloatingPoint<double> lhs;
  FloatingPoint<double> rhs;
  string local_50;
  double local_30;
  double local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_80.value_ = lhs_value;
  lhs.u_ = (FloatingPointUnion)rhs_value;
  local_30 = lhs_value;
  local_28 = rhs_value;
  bVar1 = FloatingPoint<double>::AlmostEquals((FloatingPoint<double> *)&local_80,&lhs);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_390);
    *(undefined8 *)((long)auStack_378 + *(long *)(local_380 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(local_30);
    std::__cxx11::stringstream::stringstream(local_208);
    *(undefined8 *)((long)auStack_1f0 + *(long *)(local_1f8 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(local_28);
    StringStreamToString((string *)&rhs,(stringstream *)local_390);
    StringStreamToString(&local_50,(stringstream *)local_208);
    EqFailure(this,lhs_expression,rhs_expression,(string *)&rhs,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&rhs);
    std::__cxx11::stringstream::~stringstream(local_208);
    std::__cxx11::stringstream::~stringstream(local_390);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* lhs_expression,
                                         const char* rhs_expression,
                                         RawType lhs_value,
                                         RawType rhs_value) {
  const FloatingPoint<RawType> lhs(lhs_value), rhs(rhs_value);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream lhs_ss;
  lhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << lhs_value;

  ::std::stringstream rhs_ss;
  rhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << rhs_value;

  return EqFailure(lhs_expression,
                   rhs_expression,
                   StringStreamToString(&lhs_ss),
                   StringStreamToString(&rhs_ss),
                   false);
}